

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O1

int gdAffineConcat(double *dst,double *m1,double *m2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar1 = *m1;
  dVar2 = m1[1];
  dVar3 = m2[2];
  dVar4 = *m2;
  dVar5 = m2[1];
  dVar6 = m2[3];
  dVar7 = m1[2];
  dVar8 = m1[3];
  dVar9 = m1[4];
  dVar10 = m1[5];
  dVar11 = m2[4];
  dVar12 = m2[5];
  *dst = dVar1 * dVar4 + dVar2 * dVar3;
  dst[1] = dVar1 * dVar5 + dVar2 * dVar6;
  dst[2] = dVar7 * dVar4 + dVar3 * dVar8;
  dst[3] = dVar7 * dVar5 + dVar8 * dVar6;
  dst[4] = dVar4 * dVar9 + dVar3 * dVar10 + dVar11;
  dst[5] = dVar9 * dVar5 + dVar6 * dVar10 + dVar12;
  return 1;
}

Assistant:

BGD_DECLARE(int) gdAffineConcat (double dst[6], const double m1[6], const double m2[6])
{
	double dst0, dst1, dst2, dst3, dst4, dst5;

	dst0 = m1[0] * m2[0] + m1[1] * m2[2];
	dst1 = m1[0] * m2[1] + m1[1] * m2[3];
	dst2 = m1[2] * m2[0] + m1[3] * m2[2];
	dst3 = m1[2] * m2[1] + m1[3] * m2[3];
	dst4 = m1[4] * m2[0] + m1[5] * m2[2] + m2[4];
	dst5 = m1[4] * m2[1] + m1[5] * m2[3] + m2[5];
	dst[0] = dst0;
	dst[1] = dst1;
	dst[2] = dst2;
	dst[3] = dst3;
	dst[4] = dst4;
	dst[5] = dst5;
	return GD_TRUE;
}